

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrerequisiteTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::StateResetCase::iterate(StateResetCase *this)

{
  Context *pCVar1;
  
  pCVar1 = (this->super_TestCase).m_context;
  glu::resetState(pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

TestCase::IterateResult StateResetCase::iterate (void)
{
	try
	{
		glu::resetState(m_context.getRenderContext(), m_context.getContextInfo());
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (const tcu::TestError& e)
	{
		m_testCtx.getLog() << e;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return TestCase::STOP;
}